

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMethod *stm)

{
  TypeInfo *left;
  CIdExp *pCVar1;
  CArgumentList *pCVar2;
  CCompoundStm *pCVar3;
  CFieldList *pCVar4;
  IExpression *pIVar5;
  CType *pCVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  element_type *got;
  string errorMessage;
  TypeInfo expectedType;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_90 [8];
  char local_88 [24];
  string local_70;
  TypeInfo local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: method\n",0x14);
  pCVar1 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if ((((pCVar1 == (CIdExp *)0x0) ||
       ((stm->arguments)._M_t.
        super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
        super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
        super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl == (CArgumentList *)0x0)) ||
      ((stm->returnExp)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
       _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl == (IExpression *)0x0)) ||
     ((((stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
        super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
        super__Head_base<0UL,_CType_*,_false>._M_head_impl == (CType *)0x0 ||
       ((stm->statements)._M_t.
        super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
        super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
        super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl == (CCompoundStm *)0x0)) ||
      ((stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
       super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
       super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl == (CFieldList *)0x0)))) {
    CError::CError((CError *)local_a0,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a0);
    if (local_a0 != (undefined1  [8])local_90) {
      operator_delete((void *)local_a0);
    }
    goto LAB_00122442;
  }
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&((this->currentClass).
                             super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            methods,&pCVar1->name);
  got = (pmVar8->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = got;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(pmVar8->super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"current method was got from symbol table\n",0x29);
  pCVar1 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  pCVar2 = (stm->arguments)._M_t.
           super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
           super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
           super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  pCVar3 = (stm->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar3->super_IStatement).super_PositionedNode)(pCVar3,this);
  pCVar4 = (stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t
           .super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  pIVar5 = (stm->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar5->super_PositionedNode).super_INode._vptr_INode)(pIVar5,this);
  pCVar6 = (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar6->isPrimitive == true) {
    TypeInfo::TypeInfo(&local_50,pCVar6->type);
  }
  else {
    TypeInfo::TypeInfo(&local_50,
                       (string *)
                       ((long)(pCVar6->name)._M_t.
                              super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_> + 0x18));
  }
  pCVar6 = (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar6->isPrimitive == false) {
    iVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,
                   (key_type *)
                   ((long)(pCVar6->name)._M_t.
                          super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_> + 0x18));
    if (iVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
        ._M_cur != (__node_type *)0x0) goto LAB_0012249d;
    CError::GetUndeclaredErrorMessage
              (&local_70,
               (string *)
               ((long)(((stm->returnType)._M_t.
                        super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                        super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                        super__Head_base<0UL,_CType_*,_false>._M_head_impl)->name)._M_t.
                      super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_> + 0x18));
    CError::CError((CError *)local_a0,&local_70,
                   (PositionInfo *)
                   ((long)&(((stm->returnType)._M_t.
                             super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                             super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                             super__Head_base<0UL,_CType_*,_false>._M_head_impl)->super_IWrapper).
                           super_PositionedNode + 8));
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a0);
LAB_0012259b:
    if (local_a0 != (undefined1  [8])local_90) {
      operator_delete((void *)local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
LAB_001225c1:
    bVar7 = false;
  }
  else {
LAB_0012249d:
    TypeInfo::TypeInfo((TypeInfo *)local_a0,ERROR_TYPE);
    left = &this->lastCalculatedType;
    bVar7 = operator==(left,(TypeInfo *)local_a0);
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
    if (bVar7) goto LAB_001225c1;
    bVar7 = operator!=(left,&local_50);
    if (bVar7) {
      CError::GetTypeErrorMessage_abi_cxx11_(&local_70,(CError *)&local_50,left,(TypeInfo *)got);
      CError::CError((CError *)local_a0,&local_70,
                     &(((stm->returnExp)._M_t.
                        super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                        super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                        super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                      super_PositionedNode).position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_a0);
      goto LAB_0012259b;
    }
    TypeInfo::TypeInfo((TypeInfo *)local_a0,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_a0[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_a0._1_3_;
    (this->lastCalculatedType).type = local_a0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_98);
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.className._M_dataplus._M_p != &local_50.className.field_2) {
    operator_delete(local_50.className._M_dataplus._M_p);
  }
  if (!bVar7) {
    return;
  }
LAB_00122442:
  this_00 = (this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMethod &stm ) 
{
	std::cout << "typechecker: method\n";
    if( stm.name && stm.arguments && stm.returnExp && stm.returnType && stm.statements && stm.vars ) {
        currentMethod = currentClass->methods[stm.name->name];
        std::cout << "current method was got from symbol table\n";
        stm.name->Accept( *this );
        stm.arguments->Accept( *this );
        stm.statements->Accept( *this );
        stm.vars->Accept( *this );
        stm.returnExp->Accept( *this );
        TypeInfo expectedType = stm.returnType->isPrimitive ? TypeInfo(stm.returnType->type) : TypeInfo(stm.returnType->name->name);

        bool isVisibleClass = checkTypeExisting(*stm.returnType);
        if( !isVisibleClass ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( stm.returnType->name->name );
            errors.push_back( CError( errorMessage, stm.returnType->position) );
            return;
        }

        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != expectedType ) {
            auto errorMessage = CError::GetTypeErrorMessage( expectedType, lastCalculatedType );
			errors.push_back( CError( errorMessage, stm.returnExp->position ) );
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentMethod = nullptr;
}